

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> * __thiscall
indk::NeuralNet::getEnsemble
          (vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *__return_storage_ptr__,
          NeuralNet *this,string *ename)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *neurons;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *en;
  _Base_ptr NName;
  Neuron *local_30;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&(this->Ensembles)._M_t,ename);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->Ensembles)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var1 = iVar2._M_node[2]._M_parent;
    for (NName = *(_Base_ptr *)(iVar2._M_node + 2); NName != p_Var1; NName = NName + 1) {
      local_30 = getNeuron(this,(string *)NName);
      std::vector<indk::Neuron*,std::allocator<indk::Neuron*>>::emplace_back<indk::Neuron*>
                ((vector<indk::Neuron*,std::allocator<indk::Neuron*>> *)__return_storage_ptr__,
                 &local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<indk::Neuron*> indk::NeuralNet::getEnsemble(const std::string& ename) {
    auto e = Ensembles.find(ename);
    if (e != Ensembles.end()) {
        std::vector<indk::Neuron*> neurons;
        for (const auto& en: e->second) {
            neurons.push_back(getNeuron(en));
        }
        return neurons;
    }
    return {};
}